

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_dr_prediction_z3_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  uint8_t uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 in_XMM0 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  auVar31 = _DAT_004d33c0;
  auVar30 = _DAT_004d33b0;
  auVar29 = _DAT_004d1510;
  auVar28 = _DAT_004d1500;
  auVar27 = _DAT_004cf680;
  auVar26 = _DAT_004cf670;
  auVar25 = _DAT_004cf660;
  if (0 < bw) {
    bVar32 = (byte)upsample_left;
    lVar37 = (long)(bw + bh + -1 << (bVar32 & 0x1f));
    uVar24 = (ulong)(uint)bh;
    uVar39 = 0;
    iVar35 = dy;
    do {
      if (0 < bh) {
        bVar2 = 6 - bVar32 & 0x1f;
        uVar34 = (uint)(iVar35 << (bVar32 & 0x1f)) >> 1 & 0x1f;
        lVar40 = (long)(iVar35 >> bVar2);
        uVar36 = (ulong)(uint)(0 >> bVar2);
        uVar33 = uVar39;
        uVar38 = uVar24 + 0xf;
        do {
          if (lVar37 <= lVar40) {
            if ((int)uVar36 < bh) {
              uVar1 = left[lVar37];
              lVar40 = ~uVar36 + uVar24;
              auVar58._8_4_ = (int)lVar40;
              auVar58._0_8_ = lVar40;
              auVar58._12_4_ = (int)((ulong)lVar40 >> 0x20);
              uVar36 = 0;
              do {
                auVar59._8_4_ = (int)uVar36;
                auVar59._0_8_ = uVar36;
                auVar59._12_4_ = (int)(uVar36 >> 0x20);
                auVar62 = auVar58 ^ auVar27;
                auVar67 = (auVar59 | auVar26) ^ auVar27;
                iVar61 = auVar62._0_4_;
                iVar80 = -(uint)(iVar61 < auVar67._0_4_);
                iVar64 = auVar62._4_4_;
                auVar69._4_4_ = -(uint)(iVar64 < auVar67._4_4_);
                iVar65 = auVar62._8_4_;
                iVar84 = -(uint)(iVar65 < auVar67._8_4_);
                iVar66 = auVar62._12_4_;
                auVar69._12_4_ = -(uint)(iVar66 < auVar67._12_4_);
                auVar41._4_4_ = iVar80;
                auVar41._0_4_ = iVar80;
                auVar41._8_4_ = iVar84;
                auVar41._12_4_ = iVar84;
                auVar41 = pshuflw(in_XMM0,auVar41,0xe8);
                auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar64);
                auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar66);
                auVar68._0_4_ = auVar68._4_4_;
                auVar68._8_4_ = auVar68._12_4_;
                auVar50 = pshuflw(in_XMM1,auVar68,0xe8);
                auVar69._0_4_ = auVar69._4_4_;
                auVar69._8_4_ = auVar69._12_4_;
                auVar67 = pshuflw(auVar41,auVar69,0xe8);
                auVar62._8_4_ = 0xffffffff;
                auVar62._0_8_ = 0xffffffffffffffff;
                auVar62._12_4_ = 0xffffffff;
                auVar62 = (auVar67 | auVar50 & auVar41) ^ auVar62;
                auVar62 = packssdw(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  dst[uVar33] = uVar1;
                }
                auVar50._4_4_ = iVar80;
                auVar50._0_4_ = iVar80;
                auVar50._8_4_ = iVar84;
                auVar50._12_4_ = iVar84;
                auVar69 = auVar68 & auVar50 | auVar69;
                auVar62 = packssdw(auVar69,auVar69);
                auVar67._8_4_ = 0xffffffff;
                auVar67._0_8_ = 0xffffffffffffffff;
                auVar67._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar67,auVar62 ^ auVar67);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._0_4_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride] = uVar1;
                }
                auVar62 = (auVar59 | auVar25) ^ auVar27;
                auVar51._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar51._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar51._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar51._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar70._4_4_ = auVar51._0_4_;
                auVar70._0_4_ = auVar51._0_4_;
                auVar70._8_4_ = auVar51._8_4_;
                auVar70._12_4_ = auVar51._8_4_;
                iVar80 = -(uint)(auVar62._4_4_ == iVar64);
                iVar84 = -(uint)(auVar62._12_4_ == iVar66);
                auVar12._4_4_ = iVar80;
                auVar12._0_4_ = iVar80;
                auVar12._8_4_ = iVar84;
                auVar12._12_4_ = iVar84;
                auVar81._4_4_ = auVar51._4_4_;
                auVar81._0_4_ = auVar51._4_4_;
                auVar81._8_4_ = auVar51._12_4_;
                auVar81._12_4_ = auVar51._12_4_;
                auVar62 = auVar12 & auVar70 | auVar81;
                auVar62 = packssdw(auVar62,auVar62);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar3,auVar62 ^ auVar3);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
                  dst[uVar33 + stride * 2] = uVar1;
                }
                auVar62 = pshufhw(auVar62,auVar70,0x84);
                auVar13._4_4_ = iVar80;
                auVar13._0_4_ = iVar80;
                auVar13._8_4_ = iVar84;
                auVar13._12_4_ = iVar84;
                auVar67 = pshufhw(auVar51,auVar13,0x84);
                auVar41 = pshufhw(auVar62,auVar81,0x84);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar41 | auVar67 & auVar62) ^ auVar42;
                auVar62 = packssdw(auVar42,auVar42);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
                  dst[uVar33 + stride * 3] = uVar1;
                }
                auVar62 = (auVar59 | auVar29) ^ auVar27;
                auVar52._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar52._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar52._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar52._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar14._4_4_ = auVar52._0_4_;
                auVar14._0_4_ = auVar52._0_4_;
                auVar14._8_4_ = auVar52._8_4_;
                auVar14._12_4_ = auVar52._8_4_;
                auVar67 = pshuflw(auVar81,auVar14,0xe8);
                auVar43._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
                auVar43._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
                auVar43._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
                auVar43._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
                auVar71._4_4_ = auVar43._4_4_;
                auVar71._0_4_ = auVar43._4_4_;
                auVar71._8_4_ = auVar43._12_4_;
                auVar71._12_4_ = auVar43._12_4_;
                auVar62 = pshuflw(auVar43,auVar71,0xe8);
                auVar72._4_4_ = auVar52._4_4_;
                auVar72._0_4_ = auVar52._4_4_;
                auVar72._8_4_ = auVar52._12_4_;
                auVar72._12_4_ = auVar52._12_4_;
                auVar41 = pshuflw(auVar52,auVar72,0xe8);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 & auVar67,(auVar41 | auVar62 & auVar67) ^ auVar4);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 4] = uVar1;
                }
                auVar15._4_4_ = auVar52._0_4_;
                auVar15._0_4_ = auVar52._0_4_;
                auVar15._8_4_ = auVar52._8_4_;
                auVar15._12_4_ = auVar52._8_4_;
                auVar72 = auVar71 & auVar15 | auVar72;
                auVar41 = packssdw(auVar72,auVar72);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62,auVar41 ^ auVar5);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._4_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 5] = uVar1;
                }
                auVar62 = (auVar59 | auVar28) ^ auVar27;
                auVar53._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar53._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar53._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar53._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar73._4_4_ = auVar53._0_4_;
                auVar73._0_4_ = auVar53._0_4_;
                auVar73._8_4_ = auVar53._8_4_;
                auVar73._12_4_ = auVar53._8_4_;
                iVar80 = -(uint)(auVar62._4_4_ == iVar64);
                iVar84 = -(uint)(auVar62._12_4_ == iVar66);
                auVar16._4_4_ = iVar80;
                auVar16._0_4_ = iVar80;
                auVar16._8_4_ = iVar84;
                auVar16._12_4_ = iVar84;
                auVar82._4_4_ = auVar53._4_4_;
                auVar82._0_4_ = auVar53._4_4_;
                auVar82._8_4_ = auVar53._12_4_;
                auVar82._12_4_ = auVar53._12_4_;
                auVar62 = auVar16 & auVar73 | auVar82;
                auVar62 = packssdw(auVar62,auVar62);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 6] = uVar1;
                }
                auVar62 = pshufhw(auVar62,auVar73,0x84);
                auVar17._4_4_ = iVar80;
                auVar17._0_4_ = iVar80;
                auVar17._8_4_ = iVar84;
                auVar17._12_4_ = iVar84;
                auVar67 = pshufhw(auVar53,auVar17,0x84);
                auVar41 = pshufhw(auVar62,auVar82,0x84);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar44 = (auVar41 | auVar67 & auVar62) ^ auVar44;
                auVar62 = packssdw(auVar44,auVar44);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._6_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 7] = uVar1;
                }
                auVar62 = (auVar59 | auVar31) ^ auVar27;
                auVar54._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar54._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar54._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar54._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar18._4_4_ = auVar54._0_4_;
                auVar18._0_4_ = auVar54._0_4_;
                auVar18._8_4_ = auVar54._8_4_;
                auVar18._12_4_ = auVar54._8_4_;
                auVar67 = pshuflw(auVar82,auVar18,0xe8);
                auVar45._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
                auVar45._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
                auVar45._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
                auVar45._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
                auVar74._4_4_ = auVar45._4_4_;
                auVar74._0_4_ = auVar45._4_4_;
                auVar74._8_4_ = auVar45._12_4_;
                auVar74._12_4_ = auVar45._12_4_;
                auVar62 = pshuflw(auVar45,auVar74,0xe8);
                auVar75._4_4_ = auVar54._4_4_;
                auVar75._0_4_ = auVar54._4_4_;
                auVar75._8_4_ = auVar54._12_4_;
                auVar75._12_4_ = auVar54._12_4_;
                auVar41 = pshuflw(auVar54,auVar75,0xe8);
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                auVar55 = (auVar41 | auVar62 & auVar67) ^ auVar55;
                auVar41 = packssdw(auVar55,auVar55);
                auVar62 = packsswb(auVar62 & auVar67,auVar41);
                if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 8] = uVar1;
                }
                auVar19._4_4_ = auVar54._0_4_;
                auVar19._0_4_ = auVar54._0_4_;
                auVar19._8_4_ = auVar54._8_4_;
                auVar19._12_4_ = auVar54._8_4_;
                auVar75 = auVar74 & auVar19 | auVar75;
                auVar41 = packssdw(auVar75,auVar75);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
                auVar62 = packsswb(auVar62,auVar41);
                if ((auVar62._8_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 9] = uVar1;
                }
                auVar62 = (auVar59 | auVar30) ^ auVar27;
                auVar56._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar56._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar56._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar56._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar76._4_4_ = auVar56._0_4_;
                auVar76._0_4_ = auVar56._0_4_;
                auVar76._8_4_ = auVar56._8_4_;
                auVar76._12_4_ = auVar56._8_4_;
                iVar80 = -(uint)(auVar62._4_4_ == iVar64);
                iVar84 = -(uint)(auVar62._12_4_ == iVar66);
                auVar20._4_4_ = iVar80;
                auVar20._0_4_ = iVar80;
                auVar20._8_4_ = iVar84;
                auVar20._12_4_ = iVar84;
                auVar83._4_4_ = auVar56._4_4_;
                auVar83._0_4_ = auVar56._4_4_;
                auVar83._8_4_ = auVar56._12_4_;
                auVar83._12_4_ = auVar56._12_4_;
                auVar62 = auVar20 & auVar76 | auVar83;
                auVar62 = packssdw(auVar62,auVar62);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar8,auVar62 ^ auVar8);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 10] = uVar1;
                }
                auVar62 = pshufhw(auVar62,auVar76,0x84);
                auVar21._4_4_ = iVar80;
                auVar21._0_4_ = iVar80;
                auVar21._8_4_ = iVar84;
                auVar21._12_4_ = iVar84;
                auVar67 = pshufhw(auVar56,auVar21,0x84);
                auVar41 = pshufhw(auVar62,auVar83,0x84);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar46 = (auVar41 | auVar67 & auVar62) ^ auVar46;
                auVar62 = packssdw(auVar46,auVar46);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._10_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 0xb] = uVar1;
                }
                auVar62 = (auVar59 | _DAT_004d33a0) ^ auVar27;
                auVar57._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar57._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar57._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar57._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar22._4_4_ = auVar57._0_4_;
                auVar22._0_4_ = auVar57._0_4_;
                auVar22._8_4_ = auVar57._8_4_;
                auVar22._12_4_ = auVar57._8_4_;
                auVar67 = pshuflw(auVar83,auVar22,0xe8);
                auVar47._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
                auVar47._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
                auVar47._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
                auVar47._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
                auVar77._4_4_ = auVar47._4_4_;
                auVar77._0_4_ = auVar47._4_4_;
                auVar77._8_4_ = auVar47._12_4_;
                auVar77._12_4_ = auVar47._12_4_;
                auVar62 = pshuflw(auVar47,auVar77,0xe8);
                auVar78._4_4_ = auVar57._4_4_;
                auVar78._0_4_ = auVar57._4_4_;
                auVar78._8_4_ = auVar57._12_4_;
                auVar78._12_4_ = auVar57._12_4_;
                auVar41 = pshuflw(auVar57,auVar78,0xe8);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 & auVar67,(auVar41 | auVar62 & auVar67) ^ auVar9);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 0xc] = uVar1;
                }
                auVar23._4_4_ = auVar57._0_4_;
                auVar23._0_4_ = auVar57._0_4_;
                auVar23._8_4_ = auVar57._8_4_;
                auVar23._12_4_ = auVar57._8_4_;
                auVar78 = auVar77 & auVar23 | auVar78;
                auVar41 = packssdw(auVar78,auVar78);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62,auVar41 ^ auVar10);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62._12_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 0xd] = uVar1;
                }
                auVar62 = (auVar59 | _DAT_004d3390) ^ auVar27;
                auVar48._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
                auVar48._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
                auVar48._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
                auVar48._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
                auVar79._4_4_ = auVar48._0_4_;
                auVar79._0_4_ = auVar48._0_4_;
                auVar79._8_4_ = auVar48._8_4_;
                auVar79._12_4_ = auVar48._8_4_;
                auVar60._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
                auVar60._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
                auVar60._0_4_ = auVar60._4_4_;
                auVar60._8_4_ = auVar60._12_4_;
                auVar63._4_4_ = auVar48._4_4_;
                auVar63._0_4_ = auVar48._4_4_;
                auVar63._8_4_ = auVar48._12_4_;
                auVar63._12_4_ = auVar48._12_4_;
                auVar41 = auVar60 & auVar79 | auVar63;
                auVar62 = packssdw(auVar48,auVar41);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar62 = packssdw(auVar62 ^ auVar11,auVar62 ^ auVar11);
                auVar62 = packsswb(auVar62,auVar62);
                if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  dst[uVar33 + stride * 0xe] = uVar1;
                }
                auVar62 = pshufhw(auVar62,auVar79,0x84);
                auVar41 = pshufhw(auVar41,auVar60,0x84);
                in_XMM1 = auVar41 & auVar62;
                auVar62 = pshufhw(auVar62,auVar63,0x84);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar49 = (auVar62 | in_XMM1) ^ auVar49;
                auVar62 = packssdw(auVar49,auVar49);
                in_XMM0 = packsswb(auVar62,auVar62);
                if ((in_XMM0._14_2_ >> 8 & 1) != 0) {
                  dst[uVar33 + stride * 0xf] = uVar1;
                }
                uVar36 = uVar36 + 0x10;
                uVar33 = uVar33 + stride * 0x10;
              } while ((uVar38 & 0xfffffffffffffff0) != uVar36);
            }
            break;
          }
          dst[uVar36 * stride + uVar39] =
               (uint8_t)((uint)left[lVar40] * (0x20 - uVar34) + left[lVar40 + 1] * uVar34 + 0x10 >>
                        5);
          uVar36 = uVar36 + 1;
          lVar40 = lVar40 + (1 << (bVar32 & 0x1f));
          uVar38 = uVar38 - 1;
          uVar33 = uVar33 + stride;
        } while (uVar36 != uVar24);
      }
      uVar39 = uVar39 + 1;
      iVar35 = iVar35 + dy;
    } while (uVar39 != (uint)bw);
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_left, int dx, int dy) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}